

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

bool absl::lts_20250127::container_internal::anon_unknown_2::WasNeverFull
               (CommonFields *c,size_t index)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_t sVar4;
  ctrl_t *pcVar5;
  bool local_69;
  GroupSse2Impl local_68;
  NonIterableBitMask<unsigned_short,_16,_0> local_4a;
  undefined1 local_48 [6];
  NonIterableBitMask<unsigned_short,_16,_0> empty_before;
  NonIterableBitMask<unsigned_short,_16,_0> local_2a;
  ulong uStack_28;
  NonIterableBitMask<unsigned_short,_16,_0> empty_after;
  size_t index_before;
  size_t index_local;
  CommonFields *c_local;
  
  sVar4 = CommonFields::capacity(c);
  bVar1 = is_single_group(sVar4);
  if (bVar1) {
    c_local._7_1_ = true;
  }
  else {
    sVar4 = CommonFields::capacity(c);
    uStack_28 = index - 0x10 & sVar4;
    pcVar5 = CommonFields::control(c);
    GroupSse2Impl::GroupSse2Impl((GroupSse2Impl *)local_48,pcVar5 + index);
    local_2a = GroupSse2Impl::MaskEmpty((GroupSse2Impl *)local_48);
    pcVar5 = CommonFields::control(c);
    GroupSse2Impl::GroupSse2Impl(&local_68,pcVar5 + uStack_28);
    local_4a = GroupSse2Impl::MaskEmpty(&local_68);
    bVar1 = NonIterableBitMask::operator_cast_to_bool((NonIterableBitMask *)&local_4a);
    local_69 = false;
    if (bVar1) {
      bVar1 = NonIterableBitMask::operator_cast_to_bool((NonIterableBitMask *)&local_2a);
      local_69 = false;
      if (bVar1) {
        uVar2 = NonIterableBitMask<unsigned_short,_16,_0>::TrailingZeros(&local_2a);
        uVar3 = NonIterableBitMask<unsigned_short,_16,_0>::LeadingZeros(&local_4a);
        local_69 = (ulong)uVar2 + (ulong)uVar3 < 0x10;
      }
    }
    c_local._7_1_ = local_69;
  }
  return c_local._7_1_;
}

Assistant:

static bool WasNeverFull(CommonFields& c, size_t index) {
  if (is_single_group(c.capacity())) {
    return true;
  }
  const size_t index_before = (index - Group::kWidth) & c.capacity();
  const auto empty_after = Group(c.control() + index).MaskEmpty();
  const auto empty_before = Group(c.control() + index_before).MaskEmpty();

  // We count how many consecutive non empties we have to the right and to the
  // left of `it`. If the sum is >= kWidth then there is at least one probe
  // window that might have seen a full group.
  return empty_before && empty_after &&
         static_cast<size_t>(empty_after.TrailingZeros()) +
                 empty_before.LeadingZeros() <
             Group::kWidth;
}